

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void __thiscall CMU462::DynamicScene::Scene::~Scene(Scene *this)

{
  void *pvVar1;
  XFormWidget *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *unaff_retaddr;
  
  if ((*(long *)&(in_RDI->super_SceneObject).rotations.knots._M_t._M_impl.super__Rb_tree_header.
                 _M_header != 0) &&
     (pvVar1 = *(void **)&(in_RDI->super_SceneObject).rotations.knots._M_t._M_impl.
                          super__Rb_tree_header._M_header, pvVar1 != (void *)0x0)) {
    XFormWidget::~XFormWidget(in_RDI);
    operator_delete(pvVar1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(unaff_retaddr);
  std::
  set<CMU462::DynamicScene::SceneLight_*,_std::less<CMU462::DynamicScene::SceneLight_*>,_std::allocator<CMU462::DynamicScene::SceneLight_*>_>
  ::~set((set<CMU462::DynamicScene::SceneLight_*,_std::less<CMU462::DynamicScene::SceneLight_*>,_std::allocator<CMU462::DynamicScene::SceneLight_*>_>
          *)0x20c329);
  std::
  set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  ::~set((set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
          *)0x20c33a);
  return;
}

Assistant:

Scene::~Scene() {
  if (elementTransform != nullptr) {
    delete elementTransform;
  }
}